

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  byte *pbVar1;
  xpath_stack xVar2;
  xpath_ast_node *this_00;
  uint uVar3;
  undefined8 __s;
  long lVar4;
  xpath_string *pxVar5;
  bool bVar6;
  xpath_value_type xVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  xpath_ast_node **ppxVar11;
  xpath_string *pxVar12;
  ulong uVar13;
  char_t *pcVar14;
  char *pcVar15;
  ulong uVar16;
  byte *pbVar17;
  size_t sVar18;
  xpath_allocator *pxVar19;
  char *pcVar20;
  long lVar21;
  char *pcVar22;
  byte *pbVar23;
  uint uVar24;
  long lVar25;
  char cVar26;
  xpath_ast_node **ppxVar27;
  byte bVar28;
  char *pcVar29;
  byte *pbVar30;
  size_t sVar31;
  double dVar32;
  undefined1 auVar33 [16];
  xml_node xVar34;
  undefined1 auVar35 [16];
  xpath_allocator_capture local_d8;
  xml_node local_b0;
  xpath_stack *local_a8;
  double v;
  xml_attribute local_98;
  undefined1 local_88 [16];
  xpath_node *local_78;
  undefined1 local_68 [24];
  long local_50;
  xpath_string *local_48;
  xpath_stack local_40;
  
LAB_002b514a:
  switch(this->_type) {
  case '\x12':
    goto switchD_002b5162_caseD_12;
  default:
    xVar7 = (xpath_value_type)(byte)this->_rettype;
    goto LAB_002b59bc;
  case '\x14':
    xVar7 = (xpath_value_type)this->_rettype;
    if (((this->_data).variable)->_type != xVar7) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2b11,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x03') {
      pcVar22 = *(char **)((this->_data).variable + 1);
      pcVar29 = "";
      if (pcVar22 != (char *)0x0) {
        pcVar29 = pcVar22;
      }
      __return_storage_ptr__->_buffer = pcVar29;
      goto LAB_002b5d0c;
    }
LAB_002b59bc:
    if ((char)xVar7 == '\x01') {
      local_d8._target = stack->temp;
      local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
      local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
      local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
      local_68._8_8_ = (xml_attribute_struct *)stack->result;
      local_68._0_8_ = local_d8._target;
      eval_node_set((xpath_node_set_raw *)local_88,this,c,(xpath_stack *)local_68,nodeset_eval_first
                   );
      if ((xpath_node *)CONCAT71(local_88._9_7_,local_88[8]) == local_78) goto LAB_002b5b53;
      _v = xpath_node_set_raw::first((xpath_node_set_raw *)local_88);
      string_value(__return_storage_ptr__,(xpath_node *)&v,stack->result);
      goto LAB_002b5b63;
    }
    if ((xVar7 & 0xff) != xpath_type_number) {
      if ((xVar7 & 0xff) != xpath_type_boolean) {
        __assert_fail("false && \"Wrong expression for return type string\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2b32,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      bVar6 = eval_boolean(this,c,stack);
      pcVar22 = "false";
      if (bVar6) {
        pcVar22 = "true";
      }
      __return_storage_ptr__->_buffer = pcVar22;
      goto LAB_002b5d0c;
    }
    local_d8._target = (xpath_allocator *)eval_number(this,c,stack);
    pxVar19 = stack->result;
    if (((double)local_d8._target == 0.0) && (!NAN((double)local_d8._target))) {
      pcVar22 = "0";
      goto LAB_002b5d08;
    }
    if (NAN((double)local_d8._target)) {
      pcVar22 = "NaN";
      goto LAB_002b5d08;
    }
    if (((double)local_d8._target + (double)local_d8._target == (double)local_d8._target) &&
       (!NAN((double)local_d8._target + (double)local_d8._target) && !NAN((double)local_d8._target))
       ) {
      pcVar22 = "-Infinity";
      if (0.0 < (double)local_d8._target) {
        pcVar22 = "Infinity";
      }
      goto LAB_002b5d08;
    }
    local_b0._root = (xml_node_struct *)local_d8._target;
    snprintf((char *)&local_d8,0x20,"%.*e",0xf);
    pbVar17 = (byte *)strchr((char *)&local_d8,0x65);
    if (pbVar17 == (byte *)0x0) {
      __assert_fail("exponent_string",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2107,
                    "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                   );
    }
    iVar8 = atoi((char *)(pbVar17 + 1));
    uVar16 = (ulong)((char)local_d8._target == '-');
    bVar28 = *(byte *)((long)&local_d8._target + uVar16);
    if ((bVar28 == 0x30) || ((*(byte *)((long)&local_d8._target + uVar16 + 1) | 2) != 0x2e)) {
      __assert_fail("mantissa[0] != \'0\' && (mantissa[1] == \'.\' || mantissa[1] == \',\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x210d,
                    "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                   );
    }
    pbVar30 = (byte *)((long)&local_d8._target + uVar16 + 1);
    *pbVar30 = bVar28;
    goto LAB_002b5c55;
  case '\x19':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pcVar22 = local_name((xpath_node *)&local_d8);
    goto LAB_002b5d08;
  case '\x1a':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_88,this->_left,c,stack,nodeset_eval_first);
    local_68._0_16_ = (undefined1  [16])xpath_node_set_raw::first((xpath_node_set_raw *)local_88);
    pcVar14 = local_name((xpath_node *)local_68);
    goto LAB_002b54ab;
  case '\x1b':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pcVar22 = namespace_uri((xpath_node *)&local_d8);
    goto LAB_002b5d08;
  case '\x1c':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_88,this->_left,c,stack,nodeset_eval_first);
    local_68._0_16_ = (undefined1  [16])xpath_node_set_raw::first((xpath_node_set_raw *)local_88);
    pcVar14 = namespace_uri((xpath_node *)local_68);
    goto LAB_002b54ab;
  case '\x1d':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pcVar22 = qualified_name((xpath_node *)&local_d8);
    goto LAB_002b5d08;
  case '\x1e':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_88,this->_left,c,stack,nodeset_eval_first);
    local_68._0_16_ = (undefined1  [16])xpath_node_set_raw::first((xpath_node_set_raw *)local_88);
    pcVar14 = qualified_name((xpath_node *)local_68);
LAB_002b54ab:
    __return_storage_ptr__->_buffer = pcVar14;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    goto LAB_002b5b63;
  case '\x1f':
    string_value(__return_storage_ptr__,&c->n,stack->result);
    return __return_storage_ptr__;
  case ' ':
    goto switchD_002b5162_caseD_20;
  case '!':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    sVar31 = 0x18;
    lVar21 = 0;
    ppxVar27 = &this->_right;
    for (ppxVar11 = ppxVar27; *ppxVar11 != (xpath_ast_node *)0x0; ppxVar11 = &(*ppxVar11)->_next) {
      lVar21 = lVar21 + 1;
      sVar31 = sVar31 + 0x18;
    }
    local_b0._root = (xml_node_struct *)__return_storage_ptr__;
    local_a8 = stack;
    pxVar12 = (xpath_string *)xpath_allocator::allocate(local_d8._target,sVar31);
    __return_storage_ptr__ = (xpath_string *)local_b0;
    if (pxVar12 != (xpath_string *)0x0) {
      local_50 = lVar21 + 1;
      xVar2 = *local_a8;
      local_68._0_8_ = xVar2.temp;
      local_68._8_4_ = (int)xVar2.result;
      local_68._12_4_ = xVar2.result._4_4_;
      eval_string((xpath_string *)local_88,this->_left,c,(xpath_stack *)local_68);
      pxVar12->_length_heap = (size_t)local_78;
      pxVar12->_buffer = (char_t *)local_88._0_8_;
      *(ulong *)&pxVar12->_uses_heap = CONCAT71(local_88._9_7_,local_88[8]);
      local_48 = pxVar12;
      while( true ) {
        pxVar5 = local_48;
        lVar4 = local_50;
        __return_storage_ptr__ = (xpath_string *)local_b0;
        this_00 = *ppxVar27;
        if (this_00 == (xpath_ast_node *)0x0) break;
        eval_string((xpath_string *)local_88,this_00,c,(xpath_stack *)local_68);
        pxVar12[1]._length_heap = (size_t)local_78;
        pxVar12[1]._buffer = (char_t *)local_88._0_8_;
        *(ulong *)&pxVar12[1]._uses_heap = CONCAT71(local_88._9_7_,local_88[8]);
        ppxVar27 = &this_00->_next;
        lVar21 = lVar21 + -1;
        pxVar12 = pxVar12 + 1;
      }
      if (lVar21 != 0) {
        __assert_fail("pos == count",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2a2f,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string_concat(const xpath_context &, const xpath_stack &)"
                     );
      }
      lVar25 = 0;
      lVar21 = local_50;
      pxVar12 = local_48;
      while (bVar6 = lVar21 != 0, lVar21 = lVar21 + -1, bVar6) {
        sVar31 = xpath_string::length(pxVar12);
        lVar25 = lVar25 + sVar31;
        pxVar12 = pxVar12 + 1;
      }
      pcVar14 = (char_t *)xpath_allocator::allocate(local_a8->result,lVar25 + 1);
      if (pcVar14 == (char *)0x0) goto LAB_002b5b53;
      pcVar29 = pcVar14;
      for (lVar21 = 0; lVar4 != lVar21; lVar21 = lVar21 + 1) {
        for (pcVar22 = pxVar5[lVar21]._buffer; *pcVar22 != '\0'; pcVar22 = pcVar22 + 1) {
          *pcVar29 = *pcVar22;
          pcVar29 = pcVar29 + 1;
        }
      }
      *pcVar29 = '\0';
      goto LAB_002b5b76;
    }
LAB_002b5b53:
    ((xml_node_struct *)__return_storage_ptr__)->header = (uintptr_t)"";
LAB_002b5b57:
    *(bool *)&((xml_node_struct *)__return_storage_ptr__)->name = false;
    ((xml_node_struct *)__return_storage_ptr__)->value = (char_t *)0x0;
    goto LAB_002b5b63;
  case '$':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_98._attr = (xml_attribute_struct *)stack->result;
    v = (double)local_d8._target;
    eval_string((xpath_string *)local_88,this->_left,c,(xpath_stack *)&v);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)&v);
    pcVar22 = strstr((char *)local_88._0_8_,(char *)local_68._0_8_);
    if (pcVar22 == (char *)0x0) goto LAB_002b5b53;
    pxVar19 = stack->result;
    break;
  case '%':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_98._attr = (xml_attribute_struct *)stack->result;
    v = (double)local_d8._target;
    eval_string((xpath_string *)local_88,this->_left,c,(xpath_stack *)&v);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)&v);
    pcVar29 = strstr((char *)local_88._0_8_,(char *)local_68._0_8_);
    if (pcVar29 == (char *)0x0) goto LAB_002b5b53;
    sVar31 = xpath_string::length((xpath_string *)local_68);
    sVar10 = xpath_string::length((xpath_string *)local_88);
    if (local_88[8] != true) {
      __return_storage_ptr__->_buffer = pcVar29 + sVar31;
      goto LAB_002b5b57;
    }
    pcVar22 = (char *)(local_88._0_8_ + sVar10);
    pxVar19 = stack->result;
    local_88._0_8_ = pcVar29 + sVar31;
    break;
  case '&':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_88,this->_left,c,(xpath_stack *)local_68);
    sVar31 = xpath_string::length((xpath_string *)local_88);
    dVar32 = eval_number(this->_right,c,stack);
    v = floor(dVar32 + 0.5);
    uVar16 = sVar31 + 1;
    auVar33._8_4_ = (int)(uVar16 >> 0x20);
    auVar33._0_8_ = uVar16;
    auVar33._12_4_ = 0x45300000;
    if ((auVar33._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0) <= v) goto LAB_002b5b53;
    xVar34._root = (xml_node_struct *)0x3ff0000000000000;
    if (1.0 <= v) {
      xVar34._root = (xml_node_struct *)v;
    }
    uVar13 = (long)((double)xVar34._root - 9.223372036854776e+18) &
             (long)(double)xVar34._root >> 0x3f | (long)(double)xVar34._root;
    if (uVar16 <= uVar13 - 1) {
      __assert_fail("1 <= pos && pos <= s_length + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2ab6,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    sVar31 = xpath_string::length((xpath_string *)local_88);
    if (local_88[8] != true) {
      __return_storage_ptr__->_buffer = (char_t *)(local_88._0_8_ + (uVar13 - 1));
      goto LAB_002b5b57;
    }
    pcVar22 = (char *)(local_88._0_8_ + sVar31);
    pxVar19 = stack->result;
    local_88._0_8_ = (char_t *)(local_88._0_8_ + (uVar13 - 1));
    break;
  case '\'':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_88,this->_left,c,(xpath_stack *)local_68);
    sVar31 = xpath_string::length((xpath_string *)local_88);
    dVar32 = eval_number(this->_right,c,stack);
    local_b0._root = (xml_node_struct *)floor(dVar32 + 0.5);
    dVar32 = eval_number(this->_right->_next,c,stack);
    dVar32 = floor(dVar32 + 0.5);
    v = (double)local_b0._root;
    if (NAN((double)local_b0._root)) goto LAB_002b5b53;
    v = dVar32 + (double)local_b0._root;
    if (NAN(v)) goto LAB_002b5b53;
    uVar16 = sVar31 + 1;
    auVar35._8_4_ = (int)(uVar16 >> 0x20);
    auVar35._0_8_ = uVar16;
    auVar35._12_4_ = 0x45300000;
    dVar32 = (auVar35._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
    if (((dVar32 <= (double)local_b0._root) || (v <= (double)local_b0._root)) || (v < 1.0))
    goto LAB_002b5b53;
    xVar34._root = (xml_node_struct *)0x3ff0000000000000;
    if (1.0 <= (double)local_b0._root) {
      xVar34._root = local_b0._root;
    }
    uVar9 = (long)((double)xVar34._root - 9.223372036854776e+18) &
            (long)(double)xVar34._root >> 0x3f | (long)(double)xVar34._root;
    uVar13 = (long)v >> 0x3f & (long)(v - 9.223372036854776e+18) | (long)v;
    if (dVar32 <= v) {
      uVar13 = uVar16;
    }
    if ((uVar13 <= uVar9 - 1) || (uVar16 < uVar13)) {
      __assert_fail("1 <= pos && pos <= end && end <= s_length + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2ad2,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if ((uVar13 == uVar16) && (local_88[8] == false)) {
      __return_storage_ptr__->_buffer = (char_t *)(local_88._0_8_ + (uVar9 - 1));
      goto LAB_002b5b57;
    }
    pcVar22 = (char *)(local_88._0_8_ + (uVar13 - 1));
    pxVar19 = stack->result;
    local_88._0_8_ = (char_t *)(local_88._0_8_ + (uVar9 - 1));
    break;
  case '*':
    string_value((xpath_string *)&local_d8,&c->n,stack->result);
    goto LAB_002b5601;
  case '+':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
LAB_002b5601:
    pbVar17 = (byte *)xpath_string::data((xpath_string *)&local_d8,stack->result);
    if (pbVar17 == (byte *)0x0) goto LAB_002b5d01;
    pbVar23 = (byte *)normalize_space((char_t *)pbVar17);
    goto LAB_002b5d76;
  case ',':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_40.temp = stack->result;
    local_40.result = local_d8._target;
    eval_string((xpath_string *)local_88,this->_left,c,stack);
    eval_string((xpath_string *)local_68,this->_right,c,&local_40);
    eval_string((xpath_string *)&v,this->_right->_next,c,&local_40);
    pcVar14 = xpath_string::data((xpath_string *)local_88,stack->result);
    if (pcVar14 == (char_t *)0x0) goto LAB_002b5b53;
    __s = local_68._0_8_;
    local_a8 = (xpath_stack *)v;
    local_b0._root = (xml_node_struct *)__return_storage_ptr__;
    sVar31 = xpath_string::length((xpath_string *)&v);
    pcVar22 = pcVar14;
    pcVar29 = pcVar14;
    goto LAB_002b597b;
  case ':':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
    pbVar17 = (byte *)xpath_string::data((xpath_string *)&local_d8,stack->result);
    if (pbVar17 != (byte *)0x0) {
      pcVar14 = (this->_data).string;
      pbVar23 = pbVar17;
      pbVar30 = pbVar17;
      while( true ) {
        bVar28 = *pbVar30;
        if ((ulong)bVar28 == 0) break;
        uVar16 = 1;
        if (-1 < (char)bVar28) {
          bVar28 = pcVar14[bVar28];
          uVar16 = (ulong)(-1 < (char)bVar28);
        }
        pbVar30 = pbVar30 + 1;
        *pbVar23 = bVar28;
        pbVar23 = pbVar23 + uVar16;
      }
      goto LAB_002b5d6d;
    }
    goto LAB_002b5d01;
  }
  xpath_string::from_heap(__return_storage_ptr__,(char_t *)local_88._0_8_,pcVar22,pxVar19);
  goto LAB_002b5b63;
LAB_002b597b:
  pcVar20 = pcVar22 + 1;
  cVar26 = *pcVar22;
  if (cVar26 == 0) {
    *pcVar29 = '\0';
    __return_storage_ptr__ = (xpath_string *)local_b0;
LAB_002b5b76:
    xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar14,pcVar29);
LAB_002b5b63:
    xpath_allocator_capture::~xpath_allocator_capture(&local_d8);
    return (xpath_string *)(xml_node_struct *)__return_storage_ptr__;
  }
  pcVar15 = strchr((char *)__s,(int)cVar26);
  pcVar22 = pcVar20;
  if (pcVar15 != (char *)0x0) goto code_r0x002b5999;
  goto LAB_002b59ae;
code_r0x002b5999:
  uVar16 = (long)pcVar15 - __s;
  if (uVar16 < sVar31) {
    cVar26 = *(char *)((long)local_a8 + uVar16);
LAB_002b59ae:
    *pcVar29 = cVar26;
    pcVar29 = pcVar29 + 1;
  }
  goto LAB_002b597b;
switchD_002b5162_caseD_20:
  this = this->_left;
  goto LAB_002b514a;
switchD_002b5162_caseD_12:
  pcVar22 = *(char **)&this->_data;
  goto LAB_002b5d08;
  while (pbVar1 = pbVar17 + -1, pbVar23 = pbVar17, pbVar17 = pbVar17 + -1, *pbVar1 == 0x30) {
LAB_002b5c55:
    pbVar23 = pbVar30;
    if (pbVar17 == pbVar30) break;
  }
  uVar24 = iVar8 + 1;
  *pbVar23 = 0;
  sVar18 = strlen((char *)&local_d8);
  uVar3 = -uVar24;
  if (0 < (int)uVar24) {
    uVar3 = uVar24;
  }
  sVar31 = uVar3 + sVar18 + 4;
  pbVar17 = (byte *)xpath_allocator::allocate(pxVar19,sVar31);
  if (pbVar17 != (byte *)0x0) {
    pbVar23 = pbVar17;
    if ((double)local_b0._root < 0.0) {
      pbVar23 = pbVar17 + 1;
      *pbVar17 = 0x2d;
    }
    if (iVar8 < 0) {
      *pbVar23 = 0x30;
      pbVar23 = pbVar23 + 1;
    }
    else {
      for (; 0 < (int)uVar24; uVar24 = uVar24 - 1) {
        bVar28 = *pbVar30;
        if (9 < (int)(char)bVar28 - 0x30U && bVar28 != 0) {
          __assert_fail("*mantissa == 0 || static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x213e,
                        "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                       );
        }
        bVar6 = bVar28 != 0;
        if (!bVar6) {
          bVar28 = 0x30;
        }
        pbVar30 = pbVar30 + bVar6;
        *pbVar23 = bVar28;
        pbVar23 = pbVar23 + 1;
      }
      uVar24 = 0;
    }
    if (*pbVar30 != 0) {
      *pbVar23 = 0x2e;
      for (; (int)uVar24 < 0; uVar24 = uVar24 + 1) {
        pbVar23 = pbVar23 + 1;
        *pbVar23 = 0x30;
      }
      lVar21 = 1;
      while( true ) {
        bVar28 = pbVar30[lVar21 + -1];
        if (bVar28 == 0) break;
        if (9 < (int)(char)bVar28 - 0x30U) {
          __assert_fail("static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x2154,
                        "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                       );
        }
        pbVar23[lVar21] = bVar28;
        lVar21 = lVar21 + 1;
      }
      pbVar23 = pbVar23 + lVar21;
    }
    if (pbVar17 + sVar31 <= pbVar23) {
      __assert_fail("s < result + result_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x215a,
                    "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                   );
    }
LAB_002b5d6d:
    *pbVar23 = 0;
LAB_002b5d76:
    xpath_string::from_heap_preallocated(__return_storage_ptr__,(char_t *)pbVar17,(char_t *)pbVar23)
    ;
    return __return_storage_ptr__;
  }
LAB_002b5d01:
  pcVar22 = "";
LAB_002b5d08:
  __return_storage_ptr__->_buffer = pcVar22;
LAB_002b5d0c:
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= static_cast<double>(s_length + 1) ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

			case xpath_type_number:
				return convert_number_to_string(eval_number(c, stack), stack.result);

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
				return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
			}

			default:
				assert(false && "Wrong expression for return type string"); // unreachable
				return xpath_string();
			}
		}